

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O1

bool deqp::gls::pixelNeighborhoodContainsColor
               (Surface *target,int x,int y,RGBA *color,IVec3 *compareThreshold)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  bool local_41;
  
  iVar5 = y + -1;
  local_41 = true;
  iVar2 = -1;
  do {
    bVar6 = false;
    iVar4 = -1;
    do {
      bVar3 = tcu::compareThresholdMasked
                        ((RGBA)color->m_value,
                         (RGBA)*(deUint32 *)
                                ((long)(target->m_pixels).m_ptr +
                                (long)(target->m_width * iVar5 + x + iVar4) * 4),
                         (RGBA)(compareThreshold->m_data[1] << 8 | compareThreshold->m_data[0] |
                               compareThreshold->m_data[2] << 0x10),7);
      if (bVar3) {
        if (!bVar6) {
          return local_41;
        }
        break;
      }
      iVar1 = iVar4 + 1;
      bVar6 = 0 < iVar4;
      iVar4 = iVar1;
    } while (iVar1 != 2);
    iVar4 = iVar2 + 1;
    local_41 = iVar2 < 1;
    iVar5 = iVar5 + 1;
    iVar2 = iVar4;
    if (iVar4 == 2) {
      return local_41;
    }
  } while( true );
}

Assistant:

static bool pixelNeighborhoodContainsColor (const tcu::Surface& target, int x, int y, const tcu::RGBA& color, const tcu::IVec3& compareThreshold)
{
	// should not be called for edge pixels
	DE_ASSERT(x >= 1 && x <= target.getWidth()-2);
	DE_ASSERT(y >= 1 && y <= target.getHeight()-2);

	for (int dy = -1; dy < 2; dy++)
	for (int dx = -1; dx < 2; dx++)
	{
		const tcu::RGBA	targetCmpPixel = target.getPixel(x+dx, y+dy);
		if (colorsEqual(color, targetCmpPixel, compareThreshold))
			return true;
	}

	return false;
}